

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

int __thiscall Fl_Browser::lineno(Fl_Browser *this,void *item)

{
  FL_BLINE *pFVar1;
  int iVar2;
  int iVar3;
  FL_BLINE *pFVar4;
  int iVar5;
  FL_BLINE *pFVar6;
  
  if (item == (void *)0x0) {
    return 0;
  }
  pFVar6 = this->cache;
  if (pFVar6 == (FL_BLINE *)item) {
    return this->cacheline;
  }
  pFVar4 = this->first;
  if (pFVar4 == (FL_BLINE *)item) {
    return 1;
  }
  if (this->last != (FL_BLINE *)item) {
    if (pFVar6 == (FL_BLINE *)0x0) {
      iVar5 = 1;
    }
    else {
      iVar5 = this->cacheline;
      pFVar4 = pFVar6;
    }
    pFVar6 = pFVar4->prev;
    iVar2 = iVar5 + -1;
    do {
      iVar5 = iVar5 + 1;
      pFVar1 = pFVar4->next;
      do {
        pFVar4 = pFVar1;
        iVar3 = iVar2;
        if ((pFVar6 == (FL_BLINE *)item) || (iVar3 = iVar5, pFVar4 == (FL_BLINE *)item)) {
          this->cache = (FL_BLINE *)item;
          this->cacheline = iVar3;
          return iVar3;
        }
        if (pFVar6 == (FL_BLINE *)0x0) {
          pFVar6 = (FL_BLINE *)0x0;
        }
        else {
          pFVar6 = pFVar6->prev;
          iVar2 = iVar2 + -1;
        }
        pFVar1 = (FL_BLINE *)0x0;
      } while (pFVar4 == (FL_BLINE *)0x0);
    } while( true );
  }
  return this->lines;
}

Assistant:

int Fl_Browser::lineno(void *item) const {
  FL_BLINE* l = (FL_BLINE*)item;
  if (!l) return 0;
  if (l == cache) return cacheline;
  if (l == first) return 1;
  if (l == last) return lines;
  if (!cache) {
    ((Fl_Browser*)this)->cache = first;
    ((Fl_Browser*)this)->cacheline = 1;
  }
  // assume it is near cache, search both directions:
  FL_BLINE* b = cache->prev;
  int bnum = cacheline-1;
  FL_BLINE* f = cache->next;
  int fnum = cacheline+1;
  int n = 0;
  for (;;) {
    if (b == l) {n = bnum; break;}
    if (f == l) {n = fnum; break;}
    if (b) {b = b->prev; bnum--;}
    if (f) {f = f->next; fnum++;}
  }
  ((Fl_Browser*)this)->cache = l;
  ((Fl_Browser*)this)->cacheline = n;
  return n;
}